

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ec_seckey_tweak_mul(secp256k1_context *ctx,uchar *seckey,uchar *tweak32)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  int over;
  unsigned_long _zzq_result;
  secp256k1_scalar sec;
  int vflag;
  unsigned_long _zzq_args [6];
  uint local_70;
  uint local_6c;
  undefined8 local_68;
  secp256k1_scalar *local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ec_seckey_tweak_mul_cold_3();
  }
  else if (seckey != (uchar *)0x0) {
    if (tweak32 == (uchar *)0x0) {
      secp256k1_ec_seckey_tweak_mul_cold_1();
      return 0;
    }
    lVar3 = 0;
    bVar1 = false;
    uVar4 = 0;
    do {
      uVar4 = (uint)tweak32[lVar3] | uVar4 << 8;
      if (0xc < uVar4) {
        bVar1 = true;
        uVar4 = uVar4 - (uVar4 / 0xd + (uVar4 / 0xd) * 0xc);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x20);
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar4);
    uVar2 = secp256k1_scalar_set_b32_seckey(&local_70,seckey);
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar4);
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)local_70);
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar4);
    local_70 = local_70 * uVar4;
    local_70 = local_70 - (local_70 / 0xd + (local_70 / 0xd) * 0xc);
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)local_70);
    if (uVar4 == 0) {
      uVar2 = 0;
    }
    if (bVar1) {
      uVar2 = 0;
    }
    local_6c = uVar2 ^ 1;
    local_68 = 0x4d430005;
    local_58 = 4;
    local_50 = 0;
    local_48 = 0;
    local_40 = 0;
    local_70 = local_6c - 1 & local_70;
    local_60 = &local_70;
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)local_70);
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)local_70);
    seckey[0xc] = '\0';
    seckey[0xd] = '\0';
    seckey[0xe] = '\0';
    seckey[0xf] = '\0';
    seckey[0x10] = '\0';
    seckey[0x11] = '\0';
    seckey[0x12] = '\0';
    seckey[0x13] = '\0';
    seckey[0x14] = '\0';
    seckey[0x15] = '\0';
    seckey[0x16] = '\0';
    seckey[0x17] = '\0';
    seckey[0x18] = '\0';
    seckey[0x19] = '\0';
    seckey[0x1a] = '\0';
    seckey[0x1b] = '\0';
    seckey[0] = '\0';
    seckey[1] = '\0';
    seckey[2] = '\0';
    seckey[3] = '\0';
    seckey[4] = '\0';
    seckey[5] = '\0';
    seckey[6] = '\0';
    seckey[7] = '\0';
    seckey[8] = '\0';
    seckey[9] = '\0';
    seckey[10] = '\0';
    seckey[0xb] = '\0';
    seckey[0xc] = '\0';
    seckey[0xd] = '\0';
    seckey[0xe] = '\0';
    seckey[0xf] = '\0';
    *(uint *)(seckey + 0x1c) =
         local_70 >> 0x18 | (local_70 & 0xff0000) >> 8 | (local_70 & 0xff00) << 8 | local_70 << 0x18
    ;
    return uVar2;
  }
  secp256k1_ec_seckey_tweak_mul_cold_2();
  return 0;
}

Assistant:

int secp256k1_ec_seckey_tweak_mul(const secp256k1_context* ctx, unsigned char *seckey, const unsigned char *tweak32) {
    secp256k1_scalar factor;
    secp256k1_scalar sec;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);
    ARG_CHECK(tweak32 != NULL);

    secp256k1_scalar_set_b32(&factor, tweak32, &overflow);
    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    ret &= (!overflow) & secp256k1_eckey_privkey_tweak_mul(&sec, &factor);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_get_b32(seckey, &sec);

    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_clear(&factor);
    return ret;
}